

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O0

Result __thiscall
tonk::SessionOutgoing::queueMessage
          (SessionOutgoing *this,uint queueIndex,MessageType messageType,uint8_t *data,size_t bytes)

{
  char *pcVar1;
  string *desc;
  uint in_EDX;
  long in_RSI;
  ErrorResult *in_RDI;
  ulong in_R9;
  int tries;
  OutgoingQueue *queue;
  Locker locker;
  Result *result;
  Lock *in_stack_fffffffffffffe48;
  Result *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  ErrorType type;
  ErrorResult *pEVar2;
  string *in_stack_fffffffffffffe60;
  undefined6 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  undefined4 in_stack_fffffffffffffe70;
  uint in_stack_fffffffffffffe74;
  OutgoingQueue *in_stack_fffffffffffffe78;
  OutgoingQueue *in_stack_fffffffffffffe88;
  string local_150 [32];
  string local_130 [39];
  byte local_109;
  uint local_108;
  int local_104;
  long local_100;
  string local_e0 [32];
  string local_c0 [52];
  uint local_8c;
  undefined8 local_68;
  undefined4 local_5c;
  string *local_58;
  char *local_50;
  undefined8 local_30;
  undefined4 local_24;
  string *local_20;
  char *local_18;
  
  if (in_R9 < 0x500) {
    local_8c = in_EDX;
    Locker::Locker((Locker *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    local_100 = in_RSI + 0x318 + (ulong)local_8c * 0x28;
    for (local_104 = 0; local_104 < 2; local_104 = local_104 + 1) {
      in_stack_fffffffffffffe6f =
           OutgoingQueue::Append
                     (in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                      (uint8_t *)
                      CONCAT17(in_stack_fffffffffffffe6f,
                               CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)),
                      (uint)((ulong)in_stack_fffffffffffffe60 >> 0x20));
      if ((bool)in_stack_fffffffffffffe6f) {
        Result::Success();
        local_108 = 1;
        goto LAB_001e59fa;
      }
      local_109 = 0;
      OutgoingQueue::PushAndGetFreshBuffer(in_stack_fffffffffffffe88);
      in_stack_fffffffffffffe6e = in_RDI->Source != (char *)0x0;
      if ((bool)in_stack_fffffffffffffe6e) {
        local_109 = 1;
      }
      local_108 = (uint)(byte)in_stack_fffffffffffffe6e;
      if ((local_109 & 1) == 0) {
        Result::~Result(in_stack_fffffffffffffe50);
      }
      if (local_108 != 0) goto LAB_001e59fa;
    }
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffe88);
    std::operator+(in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
    local_18 = "SessionOutgoing::queueMessage";
    local_20 = local_130;
    local_24 = 0;
    local_30 = 2;
    pEVar2 = in_RDI;
    desc = (string *)operator_new(0x38);
    ErrorResult::ErrorResult
              ((ErrorResult *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (char *)CONCAT17(in_stack_fffffffffffffe6f,
                                CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)),desc,
               (ErrorType)((ulong)pEVar2 >> 0x20),(ErrorCodeT)in_stack_fffffffffffffe50);
    pEVar2->Source = (char *)desc;
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string(local_150);
    local_108 = 1;
LAB_001e59fa:
    Locker::~Locker((Locker *)0x1e5a07);
  }
  else {
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffe88);
    std::operator+(in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
    type = (ErrorType)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    local_50 = "SessionOutgoing::queueMessage";
    local_58 = local_c0;
    local_5c = 0;
    local_68 = 5;
    pcVar1 = (char *)operator_new(0x38);
    ErrorResult::ErrorResult
              ((ErrorResult *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (char *)CONCAT17(in_stack_fffffffffffffe6f,
                                CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)),
               in_stack_fffffffffffffe60,type,(ErrorCodeT)in_stack_fffffffffffffe50);
    in_RDI->Source = pcVar1;
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_e0);
  }
  return (Result)in_RDI;
}

Assistant:

Result SessionOutgoing::queueMessage(
    unsigned queueIndex,
    protocol::MessageType messageType,
    const uint8_t* data,
    size_t bytes)
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    static_assert(TONK_MAX_UNORDERED_BYTES == TONK_MAX_UNRELIABLE_BYTES, "Update this");

    // This function only supports a few types of messages: Unreliable, Unordered, Control
    TONK_DEBUG_ASSERT(
        messageType < protocol::MessageType_StartOfReliables ||
        messageType >= protocol::MessageType_Control);

    // Message types must be in the proper queues
    TONK_DEBUG_ASSERT(
        (messageType < protocol::MessageType_StartOfReliables && queueIndex == Queue_Unreliable) ||
        (messageType == protocol::MessageType_Control && queueIndex == Queue_Unmetered) ||
        (messageType == protocol::MessageType_Unordered && queueIndex == Queue_Unmetered)
    );

    // Check for oversized messages without any additions up front to avoid
    // integer overflow issues
    if (bytes >= TONK_MAX_UNRELIABLE_BYTES)
    {
        return Result("SessionOutgoing::queueMessage",
            std::to_string(bytes) + " byte message too large",
            ErrorType::Tonk,
            Tonk_MessageTooLarge);
    }

    Locker locker(OutgoingQueueLock);

    TONK_DEBUG_ASSERT(TONK_MAX_UNRELIABLE_BYTES < MaxMessageSectionBytes);

    OutgoingQueue* queue = &Queues[queueIndex];

    // Try #1 : Append to existing buffer - Fails if too big or not created yet
    // Try #2 : Append to fresh buffer
    for (int tries = 0; tries < 2; ++tries)
    {
        // Attempt to append a message to the queue's workspace buffer
        if (queue->Append(messageType, data, static_cast<unsigned>(bytes))) {
            return Result::Success();
        }

        // Need more space- Push the workspace onto the queue and try again
        const Result result = queue->PushAndGetFreshBuffer();
        if (result.IsFail()) {
            return result;
        }
    }

    TONK_DEBUG_BREAK(); // Should never get here
    return Result("SessionOutgoing::queueMessage",
        std::to_string(bytes) + " byte message caused Append failure",
        ErrorType::Tonk,
        Tonk_Error);
}